

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O3

Aig_Obj_t * Ssw_ObjChild0Fra_(Ssw_Frm_t *p,Aig_Obj_t *pObj,int i)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  
  if (((ulong)pObj & 1) == 0) {
    uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      pAVar1 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar1 = Ssw_ObjFrame_((Ssw_Frm_t *)(ulong)(uint)p->nObjs,(Aig_Obj_t *)p->vAig2Frm,
                             *(int *)(uVar2 + 0x24));
      pAVar1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pAVar1);
    }
    return pAVar1;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                ,0xbf,"Aig_Obj_t *Ssw_ObjChild0Fra_(Ssw_Frm_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjChild0Fra_( Ssw_Frm_t * p, Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Ssw_ObjFrame_(p, Aig_ObjFanin0(pObj), i), Aig_ObjFaninC0(pObj)) : NULL;  }